

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::RepeatedField
          (RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  bool *pbVar1;
  RepeatedField<bool> *in_RSI;
  bool *in_RDI;
  int in_stack_0000005c;
  RepeatedField<bool> *in_stack_00000060;
  int in_stack_0000008c;
  RepeatedField<bool> *in_stack_00000090;
  int in_stack_000000dc;
  RepeatedField<bool> *in_stack_000000e0;
  int array_size;
  
  in_RDI[0] = false;
  in_RDI[1] = false;
  in_RDI[2] = false;
  in_RDI[3] = false;
  in_RDI[4] = false;
  in_RDI[5] = false;
  in_RDI[6] = false;
  in_RDI[7] = false;
  in_RDI[8] = false;
  in_RDI[9] = false;
  in_RDI[10] = false;
  in_RDI[0xb] = false;
  in_RDI[0xc] = false;
  in_RDI[0xd] = false;
  in_RDI[0xe] = false;
  in_RDI[0xf] = false;
  if (in_RSI->current_size_ != 0) {
    size(in_RSI);
    Reserve(in_stack_000000e0,in_stack_000000dc);
    size(in_RSI);
    AddNAlreadyReserved(in_stack_00000060,in_stack_0000005c);
    pbVar1 = Mutable(in_stack_00000090,in_stack_0000008c);
    array_size = (int)((ulong)pbVar1 >> 0x20);
    pbVar1 = Get(in_stack_00000090,in_stack_0000008c);
    size(in_RSI);
    CopyArray(in_RSI,in_RDI,pbVar1,array_size);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}